

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall Rml::ElementDocument::ReloadStyleSheet(ElementDocument *this)

{
  String *path;
  __uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> stream_00;
  bool bVar1;
  tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_> this_00;
  String *document_base_tag;
  ElementDocument *pEVar2;
  pointer *__ptr;
  ElementPtr temp_doc;
  UniquePtr<Rml::StreamFile> stream;
  Element *local_38;
  __uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> local_30;
  SharedPtr<StyleSheetContainer> local_28;
  
  if (this->context != (Context *)0x0) {
    this_00.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
    super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
         operator_new(0x158);
    StreamFile::StreamFile
              ((StreamFile *)
               this_00.
               super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
               super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl);
    path = &this->source_url;
    local_30._M_t.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
    super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
         (tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
         (tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
         this_00.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
         super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl;
    bVar1 = StreamFile::Open((StreamFile *)
                             this_00.
                             super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                             .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,path);
    if (bVar1) {
      Factory::ClearStyleSheetCache();
      Factory::ClearTemplateCache();
      stream_00._M_t.
      super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
      super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
           local_30._M_t.
           super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
           super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl;
      document_base_tag = Context::GetDocumentsBaseTag_abi_cxx11_(this->context);
      Factory::InstanceDocumentStream
                ((Factory *)&local_38,(Context *)0x0,
                 (Stream *)
                 stream_00._M_t.
                 super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
                 super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,document_base_tag);
      if (local_38 == (Element *)0x0) {
        Log::Message(LT_WARNING,"Failed to reload style sheet, could not instance document: %s",
                     (path->_M_dataplus)._M_p);
      }
      else {
        pEVar2 = rmlui_static_cast<Rml::ElementDocument*,Rml::Element*>(local_38);
        local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pEVar2->style_sheet_container).
             super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pEVar2->style_sheet_container).
             super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        SetStyleSheetContainer(this,&local_28);
        if (local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_28.
                     super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_38 != (Element *)0x0) {
        (*(local_38->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
      }
    }
    else {
      Log::Message(LT_WARNING,"Failed to open file to reload style sheet in document: %s",
                   (path->_M_dataplus)._M_p);
    }
    ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr
              ((unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> *)&local_30);
  }
  return;
}

Assistant:

void ElementDocument::ReloadStyleSheet()
{
	if (!context)
		return;

	auto stream = MakeUnique<StreamFile>();
	if (!stream->Open(source_url))
	{
		Log::Message(Log::LT_WARNING, "Failed to open file to reload style sheet in document: %s", source_url.c_str());
		return;
	}

	Factory::ClearStyleSheetCache();
	Factory::ClearTemplateCache();
	ElementPtr temp_doc = Factory::InstanceDocumentStream(nullptr, stream.get(), context->GetDocumentsBaseTag());
	if (!temp_doc)
	{
		Log::Message(Log::LT_WARNING, "Failed to reload style sheet, could not instance document: %s", source_url.c_str());
		return;
	}

	SetStyleSheetContainer(rmlui_static_cast<ElementDocument*>(temp_doc.get())->style_sheet_container);
}